

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  xr_file_system *this;
  xr_log *this_00;
  level_tools *this_01;
  clock_t cVar11;
  clock_t cVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  size_t sVar16;
  long lVar17;
  cl_parser cl;
  char *fs_spec;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cl_parser::cl_parser(&cl);
  bVar1 = cl_parser::parse(&cl,argc,argv,0x25,main::options);
  iVar14 = 1;
  if (!bVar1) {
    usage();
    goto LAB_0011e656;
  }
  bVar1 = cl_parser::exist(&cl,"-ogf");
  bVar2 = cl_parser::exist(&cl,"-omf");
  bVar3 = cl_parser::exist(&cl,"-dm");
  bVar4 = cl_parser::exist(&cl,"-level");
  bVar5 = cl_parser::exist(&cl,"-ogg2wav");
  bVar6 = cl_parser::exist(&cl,"-dds2tga");
  bVar7 = cl_parser::exist(&cl,"-unpack");
  bVar8 = cl_parser::exist(&cl,"-pack");
  bVar9 = cl_parser::exist(&cl,"-fancy");
  bVar10 = cl_parser::exist(&cl,"-xrdemo");
  uVar15 = bVar1 + 2;
  if (!bVar2) {
    uVar15 = (uint)bVar1;
  }
  uVar13 = uVar15 + 4;
  if (!bVar3) {
    uVar13 = uVar15;
  }
  uVar15 = uVar13 + 8;
  if (!bVar4) {
    uVar15 = uVar13;
  }
  uVar13 = uVar15 | 0x10;
  if (!bVar5) {
    uVar13 = uVar15;
  }
  uVar15 = uVar13 | 0x20;
  if (!bVar6) {
    uVar15 = uVar13;
  }
  uVar13 = uVar15 | 0x40;
  if (!bVar7) {
    uVar13 = uVar15;
  }
  uVar15 = uVar13 | 0x80;
  if (!bVar8) {
    uVar15 = uVar13;
  }
  uVar13 = uVar15 | 0x100;
  if (!bVar9) {
    uVar13 = uVar15;
  }
  uVar15 = uVar13 | 0x200;
  if (!bVar10) {
    uVar15 = uVar13;
  }
  if (uVar15 == 0) {
    fs_spec = (char *)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    uVar15 = 0;
    lVar17 = -0x18;
    sVar16 = cl.m_num_params;
    while (bVar1 = sVar16 != 0, sVar16 = sVar16 - 1, bVar1) {
      bVar1 = xray_re::xr_file_system::folder_exist
                        (*(char **)((long)&cl.m_options[cl.m_argc].name + lVar17));
      if (bVar1) {
        uVar15 = uVar15 | 0x80;
      }
      else {
        xray_re::xr_file_system::split_path
                  (*(char **)((long)&cl.m_options[cl.m_argc].name + lVar17),(string *)0x0,
                   (string *)0x0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs_spec);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&fs_spec,".ogf");
        if (bVar1) {
          uVar15 = uVar15 | 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&fs_spec,".omf");
          if (bVar1) {
            uVar15 = uVar15 | 2;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&fs_spec,".dm");
            if (bVar1) {
              uVar15 = uVar15 | 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&fs_spec,".xrdemo");
              if (bVar1) {
                uVar15 = uVar15 | 0x200;
              }
              else {
                bVar1 = db_tools::is_known((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&fs_spec);
                if (bVar1) {
                  uVar15 = uVar15 | 0x40;
                }
              }
            }
          }
        }
      }
      lVar17 = lVar17 + -0x18;
    }
    iVar14 = 0;
    if (uVar15 == 0) {
      if (cl.m_num_params == 0) {
        usage();
      }
      else {
        xray_re::msg("can\'t auto-detect the source format");
      }
      iVar14 = 1;
    }
    std::__cxx11::string::~string((string *)&fs_spec);
    if (uVar15 == 0) goto LAB_0011e656;
  }
  if ((uVar15 & uVar15 - 1) != 0) {
    xray_re::msg("conflicting source formats");
    iVar14 = 1;
    goto LAB_0011e656;
  }
  fs_spec = (char *)0x0;
  if (((uVar15 < 0x21) && ((0x100010100U >> ((ulong)uVar15 & 0x3f) & 1) != 0)) || (uVar15 == 0x100))
  {
    bVar1 = cl_parser::get_string(&cl,"-fs",&fs_spec);
    if (!bVar1) {
      fs_spec = "fsconverter.ltx";
    }
    bVar1 = xray_re::xr_file_system::file_exist(fs_spec);
    if (bVar1) goto LAB_0011e3e8;
    xray_re::msg("can\'t find %s",fs_spec);
  }
  else {
LAB_0011e3e8:
    bVar1 = cl_parser::get_bool(&cl,"-ro");
    if (bVar1) {
      xray_re::msg("working in read-only mode");
    }
    this = xray_re::xr_file_system::instance();
    bVar1 = xray_re::xr_file_system::initialize(this,fs_spec,(uint)bVar1);
    if (bVar1) {
      this_00 = xray_re::xr_log::instance();
      xray_re::xr_log::init(this_00,(EVP_PKEY_CTX *)"converter");
      switch(uVar15 - 1) {
      case 0:
        this_01 = (level_tools *)operator_new(0x50);
        ogf_tools::ogf_tools((ogf_tools *)this_01);
        break;
      case 1:
        this_01 = (level_tools *)operator_new(0x50);
        omf_tools::omf_tools((omf_tools *)this_01);
        break;
      case 2:
      case 4:
      case 5:
      case 6:
switchD_0011e4d4_caseD_2:
        iVar14 = 0;
        xray_re::msg("locked");
        goto LAB_0011e656;
      case 3:
        this_01 = (level_tools *)operator_new(0x50);
        dm_tools::dm_tools((dm_tools *)this_01);
        break;
      case 7:
        this_01 = (level_tools *)operator_new(0x140);
        level_tools::level_tools(this_01);
        break;
      default:
        if (uVar15 == 0x10) {
          this_01 = (level_tools *)operator_new(0x28);
          (this_01->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__ogg_tools_00235730;
          ((batch_helper *)&this_01->super_xr_surface_factory)->_vptr_batch_helper =
               (_func_int **)&this_01->m_ini;
          (((string *)&this_01->m_rmode)->_M_dataplus)._M_p = (pointer)0x0;
          *(undefined1 *)&this_01->m_ini = 0;
        }
        else if (uVar15 == 0x20) {
          this_01 = (level_tools *)operator_new(0x30);
          dds_tools::dds_tools((dds_tools *)this_01);
        }
        else if (uVar15 == 0x40) {
          this_01 = (level_tools *)operator_new(8);
          (this_01->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__tools_base_00235090;
        }
        else if (uVar15 == 0x80) {
          this_01 = (level_tools *)operator_new(0x60);
          (this_01->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__db_packer_00235050;
          (((string *)&this_01->m_rmode)->_M_dataplus)._M_p = (pointer)&this_01->m_sect_profile;
          this_01->m_ini = (xr_ini_file *)0x0;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&this_01->m_sect_profile)->_M_local_buf[0] = '\0';
          (((string *)&this_01->m_sect_wallmark_shaders)->_M_dataplus)._M_p = (pointer)0x0;
          this_01->m_debug_texture = (char *)0x0;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&this_01->m_fake_gamemtl)->_M_allocated_capacity = 0;
          this_01->m_ladders_gamemtl = (char *)0x0;
          this_01->m_ghost_eshader = (char *)0x0;
          this_01->m_shaders_xrlc_lib = (xr_shaders_xrlc_lib *)0x0;
        }
        else if (uVar15 == 0x100) {
          this_01 = (level_tools *)operator_new(0x10);
          (this_01->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__fancy_tools_00235188;
          ((batch_helper *)&this_01->super_xr_surface_factory)->_vptr_batch_helper =
               (_func_int **)0x0;
        }
        else {
          if (uVar15 != 0x200) goto switchD_0011e4d4_caseD_2;
          this_01 = (level_tools *)operator_new(0x50);
          xrdemo_tools::xrdemo_tools((xrdemo_tools *)this_01);
        }
      }
      cVar11 = clock();
      (*(this_01->super_tools_base)._vptr_tools_base[2])(this_01,&cl);
      cVar12 = clock();
      xray_re::msg("total time: %.3lfs",(double)(cVar12 - cVar11) / 1000000.0);
      (*(this_01->super_tools_base)._vptr_tools_base[1])(this_01);
      iVar14 = 0;
      goto LAB_0011e656;
    }
    xray_re::msg("can\'t initialize the file system");
  }
  iVar14 = 1;
LAB_0011e656:
  cl_parser::~cl_parser(&cl);
  return iVar14;
}

Assistant:

int main(int argc, char* argv[])
{
	static const cl_parser::option_desc options[] = {
		{"-ogf",	cl_parser::OT_BOOL},
		{"-omf",	cl_parser::OT_BOOL},
		{"-dm",		cl_parser::OT_BOOL},
		{"-level",	cl_parser::OT_BOOL},
		{"-ogg2wav",	cl_parser::OT_BOOL},
		{"-dds2tga",	cl_parser::OT_BOOL},
		{"-unpack",	cl_parser::OT_BOOL},
		{"-pack",	cl_parser::OT_BOOL},
		{"-xrdemo",	cl_parser::OT_BOOL},

		{"-11xx",	cl_parser::OT_BOOL},
		{"-2215",	cl_parser::OT_BOOL},
		{"-2945",	cl_parser::OT_BOOL},
		{"-2947ru",	cl_parser::OT_BOOL},
		{"-2947ww",	cl_parser::OT_BOOL},
		{"-xdb",	cl_parser::OT_BOOL},
		{"-xdb_ud",	cl_parser::OT_STRING},

		{"-info",	cl_parser::OT_BOOL},
		{"-skl",	cl_parser::OT_STRING},
		{"-skls",	cl_parser::OT_BOOL},
		{"-bones",	cl_parser::OT_BOOL},
		{"-comment",	cl_parser::OT_BOOL},
		{"-object",	cl_parser::OT_BOOL},
		{"-sg",		cl_parser::OT_STRING},

		{"-fs",		cl_parser::OT_STRING},
		{"-out",	cl_parser::OT_STRING},
		{"-dir",	cl_parser::OT_STRING},
		{"-flt",	cl_parser::OT_STRING},

		{"-ro",		cl_parser::OT_BOOL},

		{"-with_solid",	cl_parser::OT_BOOL},
		{"-with_bump",	cl_parser::OT_BOOL},

		{"-mode",	cl_parser::OT_STRING},
		{"-with_lods",	cl_parser::OT_BOOL},
		{"-dbgcfrm",	cl_parser::OT_BOOL},
		{"-dbgmrg",	cl_parser::OT_BOOL},
		{"-use_mt",	cl_parser::OT_BOOL},
		{"-terrain", cl_parser::OT_BOOL},

		{"-fancy",	cl_parser::OT_STRING},
	};

	cl_parser cl;
	if (!cl.parse(argc, argv, xr_dim(options), options)) {
		usage();
		return 1;
	}

	unsigned format = tools_base::TOOLS_AUTO;
	if (cl.exist("-ogf"))
		format |= tools_base::TOOLS_OGF;
	if (cl.exist("-omf"))
		format |= tools_base::TOOLS_OMF;
	if (cl.exist("-dm"))
		format |= tools_base::TOOLS_DM;
	if (cl.exist("-level"))
		format |= tools_base::TOOLS_LEVEL;
	if (cl.exist("-ogg2wav"))
		format |= tools_base::TOOLS_OGG;
	if (cl.exist("-dds2tga"))
		format |= tools_base::TOOLS_DDS;
	if (cl.exist("-unpack"))
		format |= tools_base::TOOLS_DB;
	if (cl.exist("-pack"))
		format |= tools_base::TOOLS_FOLDER;
	if (cl.exist("-fancy"))
		format |= tools_base::TOOLS_FANCY;
	if (cl.exist("-xrdemo"))
		format |= tools_base::TOOLS_XRDEMO;
	if (format == tools_base::TOOLS_AUTO) {
		std::string extension;
		size_t num_params = cl.num_params();
		for (size_t i = 0; i != num_params; ++i) {
			if (xr_file_system::folder_exist(cl.param(i))) {
				format |= tools_base::TOOLS_FOLDER;
			} else {
				xr_file_system::split_path(cl.param(i), 0, 0, &extension);
				if (extension == ".ogf")
					format |= tools_base::TOOLS_OGF;
				else if (extension == ".omf")
					format |= tools_base::TOOLS_OMF;
				else if (extension == ".dm")
					format |= tools_base::TOOLS_DM;
				else if (extension == ".xrdemo")
					format |= tools_base::TOOLS_XRDEMO;
				else if (db_tools::is_known(extension))
					format |= tools_base::TOOLS_DB;
			}
		}
		if (format == tools_base::TOOLS_AUTO) {
			if (num_params)
				msg("can't auto-detect the source format");
			else
				usage();
			return 1;
		}
	}
	if ((format & (format - 1)) != 0) {
		msg("conflicting source formats");
		return 1;
	}

	const char* fs_spec = 0;
	if (format == tools_base::TOOLS_LEVEL ||
			format == tools_base::TOOLS_DDS ||
			format == tools_base::TOOLS_FANCY ||
			format == tools_base::TOOLS_OGG) {
		if (!cl.get_string("-fs", fs_spec))
			fs_spec = DEFAULT_FS_SPEC;
		if (!xr_file_system::file_exist(fs_spec)) {
			msg("can't find %s", fs_spec);
			return 1;
		}
	}
	unsigned fs_flags = 0;
	if (cl.get_bool("-ro")) {
		fs_flags |= xr_file_system::FSF_READ_ONLY;
		msg("working in read-only mode");
	}
	xr_file_system& fs = xr_file_system::instance();
	if (!fs.initialize(fs_spec, fs_flags)) {
		msg("can't initialize the file system");
		return 1;
	}
	xr_log::instance().init("converter", 0);

	tools_base* tools = 0;
	switch (format) {
	case tools_base::TOOLS_OGF:
		tools = new ogf_tools;
		break;
	case tools_base::TOOLS_OMF:
		tools = new omf_tools;
		break;
	case tools_base::TOOLS_DM:
		tools = new dm_tools;
		break;
	case tools_base::TOOLS_LEVEL:
		tools = new level_tools;
		break;
	case tools_base::TOOLS_OGG:
		tools = new ogg_tools;
		break;
	case tools_base::TOOLS_DDS:
		tools = new dds_tools;
		break;
	case tools_base::TOOLS_DB:
		tools = new db_unpacker;
		break;
	case tools_base::TOOLS_FOLDER:
		tools = new db_packer;
		break;
	case tools_base::TOOLS_FANCY:
		tools = new fancy_tools;
		break;
	case tools_base::TOOLS_XRDEMO:
		tools = new xrdemo_tools;
		break;
	}
	if (tools == 0) {
		msg("locked");
		return 0;
	}

	clock_t start = clock();
	tools->process(cl);
	msg("total time: %.3lfs", (clock() - start) / 1.0 / CLOCKS_PER_SEC);

	delete tools;
	return 0;
}